

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::~SSBOBindingRenderCase
          (SSBOBindingRenderCase *this)

{
  SSBOBindingRenderCase *this_local;
  
  ~SSBOBindingRenderCase(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

SSBOBindingRenderCase::~SSBOBindingRenderCase (void)
{
	deinit();
}